

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_HermiteSurface::Create(ON_HermiteSurface *this,int u_count,int v_count)

{
  uint uVar1;
  double *pdVar2;
  ON_3dVector *pOVar3;
  double dVar4;
  int iVar5;
  ulong uVar6;
  ON_SimpleArray<ON_3dPoint> *this_00;
  ON_SimpleArray<ON_3dVector> *pOVar7;
  ulong uVar8;
  long lVar9;
  int i;
  int iVar10;
  int i_1;
  int j;
  long lVar11;
  
  Destroy(this);
  if (1 < v_count && 1 < u_count) {
    this->m_u_count = u_count;
    this->m_v_count = v_count;
    ON_SimpleArray<double>::SetCapacity(&this->m_u_parameters,(ulong)(uint)u_count);
    uVar1 = this->m_u_count;
    if ((-1 < (int)uVar1) && ((int)uVar1 <= (this->m_u_parameters).m_capacity)) {
      (this->m_u_parameters).m_count = uVar1;
    }
    pdVar2 = (this->m_u_parameters).m_a;
    uVar8 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar8;
    }
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      pdVar2[uVar8] = -1.23432101234321e+308;
    }
    ON_SimpleArray<double>::SetCapacity(&this->m_v_parameters,(long)this->m_v_count);
    uVar1 = this->m_v_count;
    if ((-1 < (int)uVar1) && ((int)uVar1 <= (this->m_v_parameters).m_capacity)) {
      (this->m_v_parameters).m_count = uVar1;
    }
    pdVar2 = (this->m_v_parameters).m_a;
    uVar8 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar8;
    }
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      pdVar2[uVar8] = -1.23432101234321e+308;
    }
    ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::SetCapacity
              (&this->m_grid_points,(long)this->m_u_count);
    for (iVar10 = 0; iVar10 < this->m_u_count; iVar10 = iVar10 + 1) {
      this_00 = ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::AppendNew(&this->m_grid_points);
      ON_SimpleArray<ON_3dPoint>::SetCapacity(this_00,(long)this->m_v_count);
      iVar5 = this->m_v_count;
      if ((-1 < iVar5) && (iVar5 <= this_00->m_capacity)) {
        this_00->m_count = iVar5;
      }
      ON_SimpleArray<ON_3dPoint>::Zero(this_00);
    }
    ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity
              (&this->m_u_tangents,(long)this->m_u_count);
    for (iVar10 = 0; iVar10 < this->m_u_count; iVar10 = iVar10 + 1) {
      pOVar7 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::AppendNew(&this->m_u_tangents);
      ON_SimpleArray<ON_3dVector>::SetCapacity(pOVar7,(long)this->m_v_count);
      iVar5 = this->m_v_count;
      if ((-1 < iVar5) && (iVar5 <= pOVar7->m_capacity)) {
        pOVar7->m_count = iVar5;
      }
      lVar9 = 0;
      for (lVar11 = 0; lVar11 < iVar5; lVar11 = lVar11 + 1) {
        ON_3dVector::operator=
                  ((ON_3dVector *)((long)&pOVar7->m_a->x + lVar9),&ON_3dPoint::UnsetPoint);
        iVar5 = this->m_v_count;
        lVar9 = lVar9 + 0x18;
      }
    }
    ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity
              (&this->m_v_tangents,(long)this->m_u_count);
    for (iVar10 = 0; iVar10 < this->m_u_count; iVar10 = iVar10 + 1) {
      pOVar7 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::AppendNew(&this->m_v_tangents);
      ON_SimpleArray<ON_3dVector>::SetCapacity(pOVar7,(long)this->m_v_count);
      iVar5 = this->m_v_count;
      if ((-1 < iVar5) && (iVar5 <= pOVar7->m_capacity)) {
        pOVar7->m_count = iVar5;
      }
      lVar9 = 0;
      for (lVar11 = 0; lVar11 < iVar5; lVar11 = lVar11 + 1) {
        pOVar3 = pOVar7->m_a;
        *(double *)((long)&pOVar3->z + lVar9) = ON_3dVector::UnsetVector.z;
        dVar4 = ON_3dVector::UnsetVector.y;
        pdVar2 = (double *)((long)&pOVar3->x + lVar9);
        *pdVar2 = ON_3dVector::UnsetVector.x;
        pdVar2[1] = dVar4;
        iVar5 = this->m_v_count;
        lVar9 = lVar9 + 0x18;
      }
    }
    ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity(&this->m_twists,(long)this->m_u_count);
    for (iVar10 = 0; iVar10 < this->m_u_count; iVar10 = iVar10 + 1) {
      pOVar7 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::AppendNew(&this->m_twists);
      ON_SimpleArray<ON_3dVector>::SetCapacity(pOVar7,(long)this->m_v_count);
      iVar5 = this->m_v_count;
      if ((-1 < iVar5) && (iVar5 <= pOVar7->m_capacity)) {
        pOVar7->m_count = iVar5;
      }
      lVar9 = 0;
      for (lVar11 = 0; lVar11 < iVar5; lVar11 = lVar11 + 1) {
        pOVar3 = pOVar7->m_a;
        *(double *)((long)&pOVar3->z + lVar9) = ON_3dVector::UnsetVector.z;
        dVar4 = ON_3dVector::UnsetVector.y;
        pdVar2 = (double *)((long)&pOVar3->x + lVar9);
        *pdVar2 = ON_3dVector::UnsetVector.x;
        pdVar2[1] = dVar4;
        iVar5 = this->m_v_count;
        lVar9 = lVar9 + 0x18;
      }
    }
  }
  return 1 < v_count && 1 < u_count;
}

Assistant:

bool ON_HermiteSurface::Create(int u_count, int v_count)
{
  Destroy();

  if (u_count < 2 || v_count < 2)
    return false;

  m_u_count = u_count;
  m_v_count = v_count;

  m_u_parameters.SetCapacity(m_u_count);
  m_u_parameters.SetCount(m_u_count);
  for (int i = 0; i < m_u_count; i++)
    m_u_parameters[i] = ON_UNSET_VALUE;

  m_v_parameters.SetCapacity(m_v_count);
  m_v_parameters.SetCount(m_v_count);
  for (int i = 0; i < m_v_count; i++)
    m_v_parameters[i] = ON_UNSET_VALUE;

  m_grid_points.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dPoint>& arr = m_grid_points.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    arr.Zero();
  }

  m_u_tangents.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dVector>& arr = m_u_tangents.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    for (int j = 0; j < m_v_count; j++)
      arr[j] = ON_3dPoint::UnsetPoint;
  }

  m_v_tangents.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dVector>& arr = m_v_tangents.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    for (int j = 0; j < m_v_count; j++)
      arr[j] = ON_3dVector::UnsetVector;
  }

  m_twists.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dVector>& arr = m_twists.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    for (int j = 0; j < m_v_count; j++)
      arr[j] = ON_3dVector::UnsetVector;
  }

  return true;
}